

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O1

value_type * __thiscall
nonstd::optional_lite::optional<tinyusdz::Token>::value_or<char_const*const&>
          (value_type *__return_storage_ptr__,optional<tinyusdz::Token> *this,char **v)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type *psVar2;
  char *__s;
  undefined8 uVar3;
  
  paVar1 = &(__return_storage_ptr__->str_).field_2;
  if (this->has_value_ == true) {
    (__return_storage_ptr__->str_)._M_dataplus._M_p = (pointer)paVar1;
    psVar2 = (size_type *)((long)&this->contained + 0x10);
    if (*(size_type **)&this->contained == psVar2) {
      uVar3 = *(undefined8 *)((long)&this->contained + 0x18);
      paVar1->_M_allocated_capacity = *psVar2;
      *(undefined8 *)((long)&(__return_storage_ptr__->str_).field_2 + 8) = uVar3;
    }
    else {
      (__return_storage_ptr__->str_)._M_dataplus._M_p = (pointer)*(size_type **)&this->contained;
      (__return_storage_ptr__->str_).field_2._M_allocated_capacity = *psVar2;
    }
    (__return_storage_ptr__->str_)._M_string_length = *(size_type *)((long)&this->contained + 8);
    *(size_type **)&this->contained = psVar2;
    *(undefined8 *)((long)&this->contained + 8) = 0;
    *(undefined1 *)((long)&this->contained + 0x10) = 0;
  }
  else {
    __s = *v;
    (__return_storage_ptr__->str_)._M_dataplus._M_p = (pointer)paVar1;
    (__return_storage_ptr__->str_)._M_string_length = 0;
    (__return_storage_ptr__->str_).field_2._M_local_buf[0] = '\0';
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,(ulong)__s);
  }
  return __return_storage_ptr__;
}

Assistant:

optional_constexpr14 value_type value_or( U && v ) optional_refref_qual
    {
        return has_value() ? std::move( contained.value() ) : static_cast<T>(std::forward<U>( v ) );
    }